

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::FindBlocks<unsigned_char,256>
               (uchar *data,size_t length,double block_switch_bitcost,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec,
               uint8_t *block_id)

{
  byte bVar1;
  size_t i;
  ulong uVar2;
  size_t sVar3;
  void *__s;
  void *__s_00;
  void *__s_01;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t byte_ix;
  void *pvVar8;
  size_t j;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  uVar2 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x410;
  if (uVar2 < 2) {
    for (sVar3 = 0; length != sVar3; sVar3 = sVar3 + 1) {
      block_id[sVar3] = '\0';
    }
    return;
  }
  if (uVar2 < 0x101) {
    __s = operator_new__(uVar2 << 0xb);
    memset(__s,0,uVar2 << 0xb);
    lVar5 = 0x80;
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      dVar11 = FastLog2((ulong)((vec->
                                super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->data_[lVar5 * 2]);
      *(double *)((long)__s + uVar9 * 8) = dVar11;
      lVar5 = lVar5 + 0x82;
    }
    pvVar8 = (void *)(uVar2 * 0x7f8 + (long)__s);
    lVar5 = 0x100;
    lVar6 = 0x3fc;
    while (bVar10 = lVar5 != 0, lVar5 = lVar5 + -1, bVar10) {
      lVar7 = lVar6;
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        dVar11 = *(double *)((long)__s + uVar9 * 8);
        dVar12 = BitCost((ulong)*(uint *)((long)((vec->
                                                 super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data_
                                         + lVar7));
        *(double *)((long)pvVar8 + uVar9 * 8) = dVar11 - dVar12;
        lVar7 = lVar7 + 0x410;
      }
      lVar6 = lVar6 + -4;
      pvVar8 = (void *)((long)pvVar8 + uVar2 * -8);
    }
    __s_00 = operator_new__(uVar2 * 8);
    memset(__s_00,0,uVar2 * 8);
    __s_01 = operator_new__(uVar2 * length);
    memset(__s_01,0,uVar2 * length);
    pvVar8 = __s_01;
    for (uVar9 = 0; uVar9 != length; uVar9 = uVar9 + 1) {
      bVar1 = data[uVar9];
      dVar11 = 1e+99;
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        dVar12 = *(double *)((long)__s + uVar4 * 8 + bVar1 * uVar2 * 8) +
                 *(double *)((long)__s_00 + uVar4 * 8);
        *(double *)((long)__s_00 + uVar4 * 8) = dVar12;
        if (dVar12 < dVar11) {
          block_id[uVar9] = (uint8_t)uVar4;
          dVar11 = dVar12;
        }
      }
      dVar12 = block_switch_bitcost;
      if (uVar9 < 2000) {
        dVar12 = (((double)(long)uVar9 * 0.07) / 2000.0 + 0.77) * block_switch_bitcost;
      }
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        dVar13 = *(double *)((long)__s_00 + uVar4 * 8) - dVar11;
        *(double *)((long)__s_00 + uVar4 * 8) = dVar13;
        if (dVar12 <= dVar13) {
          *(double *)((long)__s_00 + uVar4 * 8) = dVar12;
          *(undefined1 *)((long)pvVar8 + uVar4) = 1;
        }
      }
      pvVar8 = (void *)((long)pvVar8 + uVar2);
    }
    bVar1 = block_id[length - 1];
    pvVar8 = (void *)((long)__s_01 + (length - 2) * uVar2);
    for (; length != 1; length = length - 1) {
      if (*(char *)((long)pvVar8 + (ulong)bVar1) == '\x01') {
        bVar1 = block_id[length - 2];
      }
      block_id[length - 2] = bVar1;
      pvVar8 = (void *)((long)pvVar8 - uVar2);
    }
    operator_delete__(__s);
    operator_delete__(__s_00);
    operator_delete__(__s_01);
    return;
  }
  __assert_fail("vecsize <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                ,0xac,
                "void brotli::FindBlocks(const DataType *, const size_t, const double, const std::vector<Histogram<kSize>> &, uint8_t *) [DataType = unsigned char, kSize = 256]"
               );
}

Assistant:

void FindBlocks(const DataType* data, const size_t length,
                const double block_switch_bitcost,
                const std::vector<Histogram<kSize> > &vec,
                uint8_t *block_id) {
  if (vec.size() <= 1) {
    for (size_t i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return;
  }
  size_t vecsize = vec.size();
  assert(vecsize <= 256);
  double* insert_cost = new double[kSize * vecsize];
  memset(insert_cost, 0, sizeof(insert_cost[0]) * kSize * vecsize);
  for (size_t j = 0; j < vecsize; ++j) {
    insert_cost[j] = FastLog2(static_cast<uint32_t>(vec[j].total_count_));
  }
  for (size_t i = kSize; i != 0;) {
    --i;
    for (size_t j = 0; j < vecsize; ++j) {
      insert_cost[i * vecsize + j] = insert_cost[j] - BitCost(vec[j].data_[i]);
    }
  }
  double *cost = new double[vecsize];
  memset(cost, 0, sizeof(cost[0]) * vecsize);
  bool* switch_signal = new bool[length * vecsize];
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * vecsize);
  // After each iteration of this loop, cost[k] will contain the difference
  // between the minimum cost of arriving at the current byte position using
  // entropy code k, and the minimum cost of arriving at the current byte
  // position. This difference is capped at the block switch cost, and if it
  // reaches block switch cost, it means that when we trace back from the last
  // position, we need to switch here.
  for (size_t byte_ix = 0; byte_ix < length; ++byte_ix) {
    size_t ix = byte_ix * vecsize;
    size_t insert_cost_ix = data[byte_ix] * vecsize;
    double min_cost = 1e99;
    for (size_t k = 0; k < vecsize; ++k) {
      // We are coding the symbol in data[byte_ix] with entropy code k.
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = static_cast<uint8_t>(k);
      }
    }
    double block_switch_cost = block_switch_bitcost;
    // More blocks for the beginning.
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * static_cast<double>(byte_ix) / 2000;
    }
    for (size_t k = 0; k < vecsize; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        cost[k] = block_switch_cost;
        switch_signal[ix + k] = true;
      }
    }
  }
  // Now trace back from the last position and switch at the marked places.
  size_t byte_ix = length - 1;
  size_t ix = byte_ix * vecsize;
  uint8_t cur_id = block_id[byte_ix];
  while (byte_ix > 0) {
    --byte_ix;
    ix -= vecsize;
    if (switch_signal[ix + cur_id]) {
      cur_id = block_id[byte_ix];
    }
    block_id[byte_ix] = cur_id;
  }
  delete[] insert_cost;
  delete[] cost;
  delete[] switch_signal;
}